

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floating_point_stream_compression.c
# Opt level: O2

void trico_decompress_double_precision(uint32_t *number_of_doubles,double **out,uint8_t *compressed)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  void *__ptr;
  void *__ptr_00;
  double *pdVar7;
  sbyte sVar8;
  uint uVar9;
  uint uVar10;
  byte bVar11;
  ulong uVar12;
  double dVar13;
  int j;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  double dVar21;
  ulong uVar22;
  byte *pbVar23;
  ulong uVar24;
  long lVar25;
  size_t __nmemb;
  uint64_t xor [2];
  uint64_t bcode [2];
  
  bVar3 = *compressed;
  bVar11 = bVar3 >> 3 & 0xfe;
  uVar14 = (uint)bVar3 + (uint)bVar3 & 0x1e;
  sVar8 = (sbyte)uVar14;
  __nmemb = 1L << sVar8;
  uVar1 = (1L << bVar11) - 1;
  uVar2 = __nmemb - 1;
  __ptr = calloc(1L << bVar11,8);
  __ptr_00 = calloc(__nmemb,8);
  bVar3 = compressed[1];
  *number_of_doubles = (uint)bVar3 << 0x18;
  uVar9 = (uint)compressed[2] << 0x10 | (uint)bVar3 << 0x18;
  *number_of_doubles = uVar9;
  uVar9 = (uint)compressed[3] << 8 | uVar9;
  *number_of_doubles = uVar9;
  bVar3 = compressed[4];
  pbVar23 = compressed + 5;
  uVar9 = uVar9 | bVar3;
  *number_of_doubles = uVar9;
  pdVar7 = (double *)malloc((ulong)uVar9 * 8);
  *out = pdVar7;
  bVar6 = 0x40 - sVar8;
  uVar16 = 0;
  uVar12 = 0;
  uVar19 = 0;
  uVar22 = 0;
  dVar21 = 0.0;
  for (uVar10 = 0; sVar8 = (sbyte)(uVar14 >> 1), uVar10 != uVar9 >> 1; uVar10 = uVar10 + 1) {
    bVar4 = *pbVar23;
    pbVar23 = pbVar23 + 1;
    for (lVar25 = 0; lVar25 != 8; lVar25 = lVar25 + 4) {
      uVar15 = bVar4 >> ((byte)lVar25 & 0x3f) & 0xf;
      *(ulong *)((long)bcode + lVar25 * 2) = (ulong)uVar15;
      switch(uVar15) {
      case 0:
        *(undefined8 *)((long)xor + lVar25 * 2) = 0;
        goto LAB_00105f34;
      default:
        uVar24 = (ulong)*pbVar23;
        pbVar23 = pbVar23 + 1;
        goto LAB_00105e9d;
      case 2:
      case 10:
        uVar18 = (ulong)*pbVar23 << 8;
        *(ulong *)((long)xor + lVar25 * 2) = uVar18;
        uVar24 = (ulong)pbVar23[1];
        pbVar23 = pbVar23 + 2;
        break;
      case 3:
      case 0xb:
        bVar5 = *pbVar23;
        *(ulong *)((long)xor + lVar25 * 2) = (ulong)bVar5 << 0x10;
        uVar18 = (ulong)((uint)pbVar23[1] << 8 | (uint)((ulong)bVar5 << 0x10));
        *(ulong *)((long)xor + lVar25 * 2) = uVar18;
        uVar24 = (ulong)pbVar23[2];
        pbVar23 = pbVar23 + 3;
        goto LAB_00105e9a;
      case 4:
      case 0xc:
        bVar5 = *pbVar23;
        *(ulong *)((long)xor + lVar25 * 2) = (ulong)bVar5 << 0x18;
        uVar15 = (uint)pbVar23[1] << 0x10 | (uint)((ulong)bVar5 << 0x18);
        *(ulong *)((long)xor + lVar25 * 2) = (ulong)uVar15;
        uVar18 = (ulong)((uint)pbVar23[2] << 8 | uVar15);
        *(ulong *)((long)xor + lVar25 * 2) = uVar18;
        uVar24 = (ulong)pbVar23[3];
        pbVar23 = pbVar23 + 4;
        break;
      case 5:
      case 0xd:
        bVar5 = *pbVar23;
        *(ulong *)((long)xor + lVar25 * 2) = (ulong)bVar5 << 0x20;
        uVar18 = (ulong)pbVar23[1] << 0x18 | (ulong)bVar5 << 0x20;
        *(ulong *)((long)xor + lVar25 * 2) = uVar18;
        uVar18 = (ulong)pbVar23[2] << 0x10 | uVar18;
        *(ulong *)((long)xor + lVar25 * 2) = uVar18;
        uVar18 = (ulong)pbVar23[3] << 8 | uVar18;
        *(ulong *)((long)xor + lVar25 * 2) = uVar18;
        uVar24 = (ulong)pbVar23[4];
        pbVar23 = pbVar23 + 5;
        goto LAB_00105e9a;
      case 6:
      case 0xe:
        bVar5 = *pbVar23;
        *(ulong *)((long)xor + lVar25 * 2) = (ulong)bVar5 << 0x28;
        uVar18 = (ulong)pbVar23[1] << 0x20 | (ulong)bVar5 << 0x28;
        *(ulong *)((long)xor + lVar25 * 2) = uVar18;
        uVar18 = (ulong)pbVar23[2] << 0x18 | uVar18;
        *(ulong *)((long)xor + lVar25 * 2) = uVar18;
        uVar18 = (ulong)pbVar23[3] << 0x10 | uVar18;
        *(ulong *)((long)xor + lVar25 * 2) = uVar18;
        uVar18 = (ulong)pbVar23[4] << 8 | uVar18;
        *(ulong *)((long)xor + lVar25 * 2) = uVar18;
        uVar24 = (ulong)pbVar23[5];
        pbVar23 = pbVar23 + 6;
        break;
      case 7:
      case 0xf:
        bVar5 = *pbVar23;
        *(ulong *)((long)xor + lVar25 * 2) = (ulong)bVar5 << 0x30;
        uVar18 = (ulong)pbVar23[1] << 0x28 | (ulong)bVar5 << 0x30;
        *(ulong *)((long)xor + lVar25 * 2) = uVar18;
        uVar18 = (ulong)pbVar23[2] << 0x20 | uVar18;
        *(ulong *)((long)xor + lVar25 * 2) = uVar18;
        uVar18 = (ulong)pbVar23[3] << 0x18 | uVar18;
        *(ulong *)((long)xor + lVar25 * 2) = uVar18;
        uVar18 = (ulong)pbVar23[4] << 0x10 | uVar18;
        *(ulong *)((long)xor + lVar25 * 2) = uVar18;
        uVar18 = (ulong)pbVar23[5] << 8 | uVar18;
        *(ulong *)((long)xor + lVar25 * 2) = uVar18;
        uVar24 = (ulong)pbVar23[6];
        pbVar23 = pbVar23 + 7;
LAB_00105e9a:
        uVar24 = uVar24 | uVar18;
LAB_00105e9d:
        *(ulong *)((long)xor + lVar25 * 2) = uVar24;
        goto LAB_00105f34;
      case 8:
        bVar5 = *pbVar23;
        *(ulong *)((long)xor + lVar25 * 2) = (ulong)bVar5 << 0x38;
        uVar18 = (ulong)pbVar23[1] << 0x30 | (ulong)bVar5 << 0x38;
        *(ulong *)((long)xor + lVar25 * 2) = uVar18;
        uVar18 = (ulong)pbVar23[2] << 0x28 | uVar18;
        *(ulong *)((long)xor + lVar25 * 2) = uVar18;
        uVar18 = (ulong)pbVar23[3] << 0x20 | uVar18;
        *(ulong *)((long)xor + lVar25 * 2) = uVar18;
        uVar18 = (ulong)pbVar23[4] << 0x18 | uVar18;
        *(ulong *)((long)xor + lVar25 * 2) = uVar18;
        uVar18 = (ulong)pbVar23[5] << 0x10 | uVar18;
        *(ulong *)((long)xor + lVar25 * 2) = uVar18;
        uVar18 = (ulong)pbVar23[6] << 8 | uVar18;
        *(ulong *)((long)xor + lVar25 * 2) = uVar18;
        uVar24 = (ulong)pbVar23[7];
        pbVar23 = pbVar23 + 8;
      }
      *(ulong *)((long)xor + lVar25 * 2) = uVar24 | uVar18;
LAB_00105f34:
    }
    for (lVar25 = 0; lVar25 != 0x10; lVar25 = lVar25 + 8) {
      if (8 < *(ulong *)((long)bcode + lVar25)) {
        uVar12 = uVar22;
      }
      dVar13 = (double)(uVar12 ^ *(ulong *)((long)xor + lVar25));
      *(double *)((long)__ptr + uVar16 * 8) = dVar13;
      *(long *)((long)__ptr_00 + uVar19 * 8) = (long)dVar13 - (long)dVar21;
      uVar16 = ((ulong)dVar13 >> (0x40 - bVar11 & 0x3f) ^ uVar16 << bVar11) & uVar1;
      uVar19 = ((ulong)((long)dVar13 - (long)dVar21) >> (bVar6 & 0x3f) ^ uVar19 << sVar8) & uVar2;
      uVar22 = *(long *)((long)__ptr_00 + uVar19 * 8) + (long)dVar13;
      *(double *)((long)pdVar7 + lVar25) = dVar13;
      uVar12 = *(ulong *)((long)__ptr + uVar16 * 8);
      dVar21 = dVar13;
    }
    pdVar7 = pdVar7 + 2;
  }
  if ((bVar3 & 1) != 0) {
    bVar3 = *pbVar23;
    pbVar23 = pbVar23 + 1;
    uVar18 = 2;
    lVar25 = 0;
    for (uVar24 = 0; (long)uVar24 < (long)(int)uVar18; uVar24 = uVar24 + 1) {
      uVar9 = bVar3 >> ((byte)lVar25 & 0x3f) & 0xf;
      *(ulong *)((long)bcode + lVar25 * 2) = (ulong)uVar9;
      switch(uVar9) {
      case 0:
        *(undefined8 *)((long)xor + lVar25 * 2) = 0;
        goto LAB_00106252;
      case 1:
        bVar4 = *pbVar23;
        pbVar23 = pbVar23 + 1;
        *(ulong *)((long)xor + lVar25 * 2) = (ulong)bVar4;
        if ((ulong)bVar4 == 0) {
          uVar18 = uVar24;
        }
        uVar18 = uVar18 & 0xffffffff;
        goto LAB_00106252;
      default:
        uVar17 = (ulong)*pbVar23 << 8;
        *(ulong *)((long)xor + lVar25 * 2) = uVar17;
        uVar20 = (ulong)pbVar23[1];
        pbVar23 = pbVar23 + 2;
        break;
      case 3:
      case 0xb:
        bVar4 = *pbVar23;
        *(ulong *)((long)xor + lVar25 * 2) = (ulong)bVar4 << 0x10;
        uVar20 = (ulong)((uint)pbVar23[1] << 8 | (uint)((ulong)bVar4 << 0x10));
        *(ulong *)((long)xor + lVar25 * 2) = uVar20;
        uVar17 = (ulong)pbVar23[2];
        pbVar23 = pbVar23 + 3;
        goto LAB_00106127;
      case 4:
      case 0xc:
        bVar4 = *pbVar23;
        *(ulong *)((long)xor + lVar25 * 2) = (ulong)bVar4 << 0x18;
        uVar9 = (uint)pbVar23[1] << 0x10 | (uint)((ulong)bVar4 << 0x18);
        *(ulong *)((long)xor + lVar25 * 2) = (ulong)uVar9;
        uVar17 = (ulong)((uint)pbVar23[2] << 8 | uVar9);
        *(ulong *)((long)xor + lVar25 * 2) = uVar17;
        uVar20 = (ulong)pbVar23[3];
        pbVar23 = pbVar23 + 4;
        break;
      case 5:
      case 0xd:
        bVar4 = *pbVar23;
        *(ulong *)((long)xor + lVar25 * 2) = (ulong)bVar4 << 0x20;
        uVar20 = (ulong)pbVar23[1] << 0x18 | (ulong)bVar4 << 0x20;
        *(ulong *)((long)xor + lVar25 * 2) = uVar20;
        uVar20 = (ulong)pbVar23[2] << 0x10 | uVar20;
        *(ulong *)((long)xor + lVar25 * 2) = uVar20;
        uVar20 = (ulong)pbVar23[3] << 8 | uVar20;
        *(ulong *)((long)xor + lVar25 * 2) = uVar20;
        uVar17 = (ulong)pbVar23[4];
        pbVar23 = pbVar23 + 5;
        goto LAB_00106127;
      case 6:
      case 0xe:
        bVar4 = *pbVar23;
        *(ulong *)((long)xor + lVar25 * 2) = (ulong)bVar4 << 0x28;
        uVar17 = (ulong)pbVar23[1] << 0x20 | (ulong)bVar4 << 0x28;
        *(ulong *)((long)xor + lVar25 * 2) = uVar17;
        uVar17 = (ulong)pbVar23[2] << 0x18 | uVar17;
        *(ulong *)((long)xor + lVar25 * 2) = uVar17;
        uVar17 = (ulong)pbVar23[3] << 0x10 | uVar17;
        *(ulong *)((long)xor + lVar25 * 2) = uVar17;
        uVar17 = (ulong)pbVar23[4] << 8 | uVar17;
        *(ulong *)((long)xor + lVar25 * 2) = uVar17;
        uVar20 = (ulong)pbVar23[5];
        pbVar23 = pbVar23 + 6;
        break;
      case 7:
      case 0xf:
        bVar4 = *pbVar23;
        *(ulong *)((long)xor + lVar25 * 2) = (ulong)bVar4 << 0x30;
        uVar20 = (ulong)pbVar23[1] << 0x28 | (ulong)bVar4 << 0x30;
        *(ulong *)((long)xor + lVar25 * 2) = uVar20;
        uVar20 = (ulong)pbVar23[2] << 0x20 | uVar20;
        *(ulong *)((long)xor + lVar25 * 2) = uVar20;
        uVar20 = (ulong)pbVar23[3] << 0x18 | uVar20;
        *(ulong *)((long)xor + lVar25 * 2) = uVar20;
        uVar20 = (ulong)pbVar23[4] << 0x10 | uVar20;
        *(ulong *)((long)xor + lVar25 * 2) = uVar20;
        uVar20 = (ulong)pbVar23[5] << 8 | uVar20;
        *(ulong *)((long)xor + lVar25 * 2) = uVar20;
        uVar17 = (ulong)pbVar23[6];
        pbVar23 = pbVar23 + 7;
LAB_00106127:
        uVar17 = uVar17 | uVar20;
LAB_0010612a:
        *(ulong *)((long)xor + lVar25 * 2) = uVar17;
        goto LAB_00106252;
      case 8:
        bVar4 = *pbVar23;
        *(ulong *)((long)xor + lVar25 * 2) = (ulong)bVar4 << 0x38;
        uVar17 = (ulong)pbVar23[1] << 0x30 | (ulong)bVar4 << 0x38;
        *(ulong *)((long)xor + lVar25 * 2) = uVar17;
        uVar17 = (ulong)pbVar23[2] << 0x28 | uVar17;
        *(ulong *)((long)xor + lVar25 * 2) = uVar17;
        uVar17 = (ulong)pbVar23[3] << 0x20 | uVar17;
        *(ulong *)((long)xor + lVar25 * 2) = uVar17;
        uVar17 = (ulong)pbVar23[4] << 0x18 | uVar17;
        *(ulong *)((long)xor + lVar25 * 2) = uVar17;
        uVar17 = (ulong)pbVar23[5] << 0x10 | uVar17;
        *(ulong *)((long)xor + lVar25 * 2) = uVar17;
        uVar17 = (ulong)pbVar23[6] << 8 | uVar17;
        *(ulong *)((long)xor + lVar25 * 2) = uVar17;
        uVar20 = (ulong)pbVar23[7];
        pbVar23 = pbVar23 + 8;
        break;
      case 9:
        uVar17 = (ulong)*pbVar23;
        pbVar23 = pbVar23 + 1;
        goto LAB_0010612a;
      }
      *(ulong *)((long)xor + lVar25 * 2) = uVar20 | uVar17;
LAB_00106252:
      lVar25 = lVar25 + 4;
    }
    uVar24 = 0;
    if ((int)uVar18 < 1) {
      uVar18 = uVar24;
    }
    for (; uVar18 != uVar24; uVar24 = uVar24 + 1) {
      if (8 < bcode[uVar24]) {
        uVar12 = uVar22;
      }
      dVar13 = (double)(uVar12 ^ xor[uVar24]);
      *(double *)((long)__ptr + uVar16 * 8) = dVar13;
      *(long *)((long)__ptr_00 + uVar19 * 8) = (long)dVar13 - (long)dVar21;
      uVar16 = ((ulong)dVar13 >> (0x40 - bVar11 & 0x3f) ^ uVar16 << bVar11) & uVar1;
      uVar19 = ((ulong)((long)dVar13 - (long)dVar21) >> (bVar6 & 0x3f) ^ uVar19 << sVar8) & uVar2;
      uVar22 = *(long *)((long)__ptr_00 + uVar19 * 8) + (long)dVar13;
      pdVar7[uVar24] = dVar13;
      uVar12 = *(ulong *)((long)__ptr + uVar16 * 8);
      dVar21 = dVar13;
    }
  }
  free(__ptr);
  free(__ptr_00);
  return;
}

Assistant:

void trico_decompress_double_precision(uint32_t* number_of_doubles, double** out, const uint8_t* compressed)
  {
  uint8_t hash_info = *compressed++;

  uint64_t hash1_size_exponent = (hash_info >> 4) << 1;
  uint64_t hash2_size_exponent = (hash_info & 15) << 1;

  const uint64_t hash1_size = (uint64_t)1 << hash1_size_exponent;
  const uint64_t hash2_size = (uint64_t)1 << hash2_size_exponent;
  const uint64_t hash1_mask = hash1_size - 1;
  const uint64_t hash2_mask = hash2_size - 1;

  uint64_t* hash_table_1 = (uint64_t*)trico_calloc(hash1_size, 8);
  uint64_t* hash_table_2 = (uint64_t*)trico_calloc(hash2_size, 8);

  *number_of_doubles = ((uint32_t)(*compressed++)) << 24;
  *number_of_doubles |= ((uint32_t)(*compressed++)) << 16;
  *number_of_doubles |= ((uint32_t)(*compressed++)) << 8;
  *number_of_doubles |= ((uint32_t)(*compressed++));
  *out = (double*)trico_malloc(*number_of_doubles * sizeof(double));

  uint64_t bc;
  uint64_t bcode[2];
  uint64_t xor[2];
  uint64_t value;
  uint64_t hash1 = 0;
  uint64_t prediction1 = 0;
  uint64_t hash2 = 0;
  uint64_t prediction2 = 0;
  uint64_t stride;
  uint64_t last_value = 0;
  uint64_t* p_out = (uint64_t*)(*out);

  const uint32_t cnt = *number_of_doubles / 2;
  for (uint32_t q = 0; q < cnt; ++q)
    {
    bc = ((uint32_t)(*compressed++));
    for (int j = 0; j < 2; ++j)
      {
      uint8_t b = (bc >> (j * 4)) & 15;
      bcode[j] = b;
      switch (b)
        {
        case 0:
        {
        xor[j] = 0;
        break;
        }
        case 1:
        {
        xor[j] = ((uint64_t)(*compressed++));
        break;
        }
        case 2:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 3:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 4:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 5:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 6:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 7:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 48;
        xor[j] |= ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 8:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 56;
        xor[j] |= ((uint64_t)(*compressed++)) << 48;
        xor[j] |= ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 9:
        {
        xor[j] = ((uint64_t)(*compressed++));
        break;
        }
        case 10:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 11:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 12:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 13:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 14:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 15:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 48;
        xor[j] |= ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        }
      }
    for (int j = 0; j < 2; ++j)
      {
      if (bcode[j] > 8)
        prediction1 = prediction2;

      value = xor[j] ^ prediction1;

      hash_table_1[hash1] = value;
      hash1 = trico_compute_hash1_64(hash1, value, hash1_size_exponent, hash1_mask);
      prediction1 = hash_table_1[hash1];

      stride = value - last_value;
      hash_table_2[hash2] = stride;
      hash2 = trico_compute_hash2_64(hash2, stride, hash2_size_exponent, hash2_mask);
      prediction2 = value + hash_table_2[hash2];
      last_value = value;

      *p_out++ = value;
      }
    }

  if (*number_of_doubles & 1)
    {
    bc = ((uint32_t)(*compressed++));
    int max_j = 2;
    for (int j = 0; j < max_j; ++j)
      {
      uint8_t b = (bc >> (j * 4)) & 15;
      bcode[j] = b;
      switch (b)
        {
        case 0:
        {
        xor[j] = 0;
        break;
        }
        case 1:
        {
        xor[j] = ((uint64_t)(*compressed++));
        if (xor[j] == 0)
          max_j = j;
        break;
        }
        case 2:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 3:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 4:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 5:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 6:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 7:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 48;
        xor[j] |= ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 8:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 56;
        xor[j] |= ((uint64_t)(*compressed++)) << 48;
        xor[j] |= ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 9:
        {
        xor[j] = ((uint64_t)(*compressed++));
        break;
        }
        case 10:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 11:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 12:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 13:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 14:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 15:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 48;
        xor[j] |= ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        }
      }
    for (int j = 0; j < max_j; ++j)
      {
      if (bcode[j] > 8)
        prediction1 = prediction2;

      value = xor[j] ^ prediction1;

      hash_table_1[hash1] = value;
      hash1 = trico_compute_hash1_64(hash1, value, hash1_size_exponent, hash1_mask);
      prediction1 = hash_table_1[hash1];

      stride = value - last_value;
      hash_table_2[hash2] = stride;
      hash2 = trico_compute_hash2_64(hash2, stride, hash2_size_exponent, hash2_mask);
      prediction2 = value + hash_table_2[hash2];
      last_value = value;

      *p_out++ = value;
      }
    }

  trico_free(hash_table_1);
  trico_free(hash_table_2);
  }